

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucs2fontmap.c
# Opt level: O0

int ucs2fontmap(char *s,uint ucs,int enc)

{
  char cVar1;
  int iVar2;
  int enc_local;
  uint ucs_local;
  char *s_local;
  
  cVar1 = (char)ucs;
  switch(enc) {
  case 0:
    *s = (char)(ucs >> 8);
    s[1] = cVar1;
    return 0;
  case 1:
    if ((ucs < 0x100) && (ucs != 0)) {
      *s = '\0';
      s[1] = cVar1;
      return 1;
    }
    break;
  case 2:
    if (ucs < 0xa1) {
      *s = '\0';
      s[1] = cVar1;
      return 2;
    }
    if (ucs < 0x180) {
      if (0x9f < ucs) {
        *s = '\0';
        s[1] = iso8859_2_page00[ucs - 0xa0];
        if (s[1] != '\0') {
          return 2;
        }
      }
    }
    else if ((ucs < 0x2e0) && (0x2bf < ucs)) {
      *s = '\0';
      s[1] = ""[ucs - 0x2c0];
      if (s[1] != '\0') {
        return 2;
      }
    }
    break;
  case 3:
    iVar2 = iso8859_3_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 3;
    }
    break;
  case 4:
    iVar2 = iso8859_4_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 4;
    }
    break;
  case 5:
    iVar2 = iso8859_5_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 5;
    }
    break;
  case 6:
    iVar2 = iso8859_6_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 6;
    }
    break;
  case 7:
    iVar2 = iso8859_7_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 7;
    }
    break;
  case 8:
    iVar2 = iso8859_8_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 8;
    }
    break;
  case 9:
    iVar2 = iso8859_9_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 9;
    }
    break;
  case 10:
    iVar2 = iso8859_10_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 10;
    }
    break;
  case 0xb:
    iVar2 = iso8859_13_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0xb;
    }
    break;
  case 0xc:
    iVar2 = iso8859_14_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0xc;
    }
    break;
  case 0xd:
    iVar2 = iso8859_15_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0xd;
    }
    break;
  case 0xe:
    iVar2 = koi8_r_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0xe;
    }
    break;
  case 0xf:
    iVar2 = big5_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0xf;
    }
    break;
  case 0x10:
    iVar2 = ksc5601_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x10;
    }
    break;
  case 0x11:
    iVar2 = gb2312_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x11;
    }
    break;
  case 0x12:
    iVar2 = jisx0201_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x12;
    }
    break;
  case 0x13:
    iVar2 = jisx0208_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x13;
    }
    break;
  case 0x14:
    iVar2 = jisx0212_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x14;
    }
    break;
  case 0x15:
    if (ucs < 0xf8) {
      if (0x1f < ucs) {
        *s = '\0';
        s[1] = " !"[ucs - 0x20];
        if (s[1] != '\0') {
          return 0x15;
        }
      }
    }
    else if (ucs < 0x193) {
      if (0x191 < ucs) {
        *s = '\0';
        s[1] = unicode_to_symbol_1b_0192[ucs - 0x192];
        if (s[1] != '\0') {
          return 0x15;
        }
      }
    }
    else if (ucs < 0x3d7) {
      if (0x390 < ucs) {
        *s = '\0';
        s[1] = "ABGDEZHQIKLMNXOPR"[ucs - 0x391];
        if (s[1] != '\0') {
          return 0x15;
        }
      }
    }
    else if (ucs < 0x232b) {
      if (0x2021 < ucs) {
        *s = '\0';
        s[1] = unicode_to_symbol_1b_2022[ucs - 0x2022];
        if (s[1] != '\0') {
          return 0x15;
        }
      }
    }
    else if (ucs < 0x25cb) {
      if (0x25c9 < ucs) {
        *s = '\0';
        s[1] = unicode_to_symbol_1b_25CA[ucs - 0x25ca];
        if (s[1] != '\0') {
          return 0x15;
        }
      }
    }
    else if (ucs < 0x2667) {
      if (0x265f < ucs) {
        *s = '\0';
        s[1] = unicode_to_symbol_1b_2660[ucs - 0x2660];
        if (s[1] != '\0') {
          return 0x15;
        }
      }
    }
    else if (ucs < 0xf6dc) {
      if (0xf6d8 < ucs) {
        *s = '\0';
        s[1] = unicode_to_symbol_1b_F6D9[ucs - 0xf6d9];
        if (s[1] != '\0') {
          return 0x15;
        }
      }
    }
    else if ((ucs < 0xf8ff) && (0xf8e4 < ucs)) {
      *s = '\0';
      s[1] = unicode_to_symbol_1b_F8E5[ucs - 0xf8e5];
      if (s[1] != '\0') {
        return 0x15;
      }
    }
    break;
  case 0x16:
    if (ucs < 0xa1) {
      if (0x1f < ucs) {
        *s = '\0';
        s[1] = " "[ucs - 0x20];
        if (s[1] != '\0') {
          return 0x16;
        }
      }
    }
    else if (ucs < 0x2196) {
      if (0x2191 < ucs) {
        *s = '\0';
        s[1] = unicode_to_dingbats_1b_2192[ucs - 0x2192];
        if (s[1] != '\0') {
          return 0x16;
        }
      }
    }
    else if (ucs < 0x246a) {
      if (0x245f < ucs) {
        *s = '\0';
        s[1] = unicode_to_dingbats_1b_2460[ucs - 0x2460];
        if (s[1] != '\0') {
          return 0x16;
        }
      }
    }
    else if (ucs < 0x2667) {
      if (0x259f < ucs) {
        *s = '\0';
        s[1] = "n"[ucs - 0x25a0];
        if (s[1] != '\0') {
          return 0x16;
        }
      }
    }
    else if (ucs < 0x27bf) {
      if (0x2700 < ucs) {
        *s = '\0';
        s[1] = "!\"#$"[ucs - 0x2701];
        if (s[1] != '\0') {
          return 0x16;
        }
      }
    }
    else if ((ucs < 0xf8e5) && (0xf8d6 < ucs)) {
      *s = '\0';
      s[1] = unicode_to_dingbats_1b_F8D7[ucs - 0xf8d7];
      if (s[1] != '\0') {
        return 0x16;
      }
    }
    break;
  case 0x17:
    iVar2 = koi8_u_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x17;
    }
    break;
  case 0x18:
    iVar2 = cp1251_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x18;
    }
    break;
  case 0x19:
    iVar2 = iso8859_11_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x19;
    }
    break;
  case 0x1a:
    iVar2 = cp936ext_wctomb((void *)0x0,(uchar *)s,ucs,2);
    if (0 < iVar2) {
      return 0x1a;
    }
  }
  return -1;
}

Assistant:

static int ucs2fontmap(char *s, unsigned int ucs, int enc) {
  switch(enc) {
  case 0:	/* iso10646-1 */
    s[0] = (char) ((ucs & 0xFF00) >> 8);
    s[1] = (char) (ucs & 0xFF);
    return 0;
  case 1:	/* iso8859-1 */
    if (ucs <= 0x00FF) {
      if (ucs >= 0x0001) {
        s[0] = 0;
        s[1] = (char) (ucs & 0xFF);
        return 1;
      }
    }
    break;
  case 2:	/* iso8859-2 */
    if (ucs <= 0x00a0) {
      s[0] = 0;
      s[1] = (char) ucs;
      return 2;
    } else if (ucs < 0x0180) {
      if (ucs >= 0x00a0) {
	s[0] = 0;
	s[1] = (char)  iso8859_2_page00[ucs-0x00a0];
        if (s[1]) return 2;
      }
    } else if (ucs < 0x02e0) {
      if (ucs >= 0x02c0) {
        s[0] = 0;
        s[1] = (char) iso8859_2_page02[ucs-0x02c0];
        if (s[1]) return 2;
      }	
    }
    break;
  case 3:	/* iso8859-3 */
    if (iso8859_3_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 3;
    } 
    break;
  case 4:	/* iso8859-4 */
    if (iso8859_4_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 4;
    } 
    break;
  case 5:	/* iso8859-5 */
    if (iso8859_5_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 5;
    } 
    break;
  case 6:	/* iso8859-6 */
    if (iso8859_6_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 6;
    } 
    break;
  case 7:	/* iso8859-7 */
    if (iso8859_7_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 7;
    } 
    break;
  case 8:	/* iso8859-8 */
    if (iso8859_8_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 8;
    } 
    break;
  case 9:	/* iso8859-9 */
    if (iso8859_9_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 9;
    } 
    break;
  case 10:	/* iso8859-10 */
    if (iso8859_10_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 10;
    } 
    break;
  case 25:	/* iso8859-11 */
    if (iso8859_11_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 25;
    } 
    break;
  case 11:	/* iso8859-13 */
    if (iso8859_13_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 11;
    } 
    break;
  case 12:	/* iso8859-14 */
    if (iso8859_14_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 12;
    } 
    break;
  case 13:	/* iso8859-15 */
    if (iso8859_15_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 13;
    } 
    break;
  case 14:	/* koi8-r */
    if (koi8_r_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 14;
    } 
    break;
  case 15:	/* big5 */
    if (big5_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 15;
    } 
    break;
  case 16:	/* ksc5601.1987-0 */
    if (ksc5601_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 16;
    } 
    break;
  case 17:	/* gb2312.1980-0 */
    if (gb2312_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 17;
    } 
    break;
  case 18:	/* jisx0201.1976-0 */
    if (jisx0201_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 18;
    } 
    break;
  case 19:	/* jisx0208.1983-0 */
    if (jisx0208_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 19;
    } 
    break;
  case 20:	/* jisx0212.1990-0 */
    if (jisx0212_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 20;
    } 
    break;
  case 21:	/* symbol */
    if (ucs <= 0x00F7) {
      if (ucs >= 0x0020) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0020[ucs - 0x0020];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x0192) {
      if (ucs >= 0x0192) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0192[ucs - 0x0192];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x03D6) {
      if (ucs >= 0x0391) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0391[ucs - 0x0391];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x232A) {
      if (ucs >= 0x2022) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_2022[ucs - 0x2022];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x25CA) {
      if (ucs >= 0x25CA) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_25CA[ucs - 0x25CA];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x2666) {
      if (ucs >= 0x2660) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_2660[ucs - 0x2660];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0xF6DB) {
      if (ucs >= 0xF6D9) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_F6D9[ucs - 0xF6D9];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0xF8FE) {
      if (ucs >= 0xF8E5) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_F8E5[ucs - 0xF8E5];
        if (s[1]) return 21;
      }
    }
    break;
  case 22:	/* dingbats */
    if (ucs <= 0x00A0) {
      if (ucs >= 0x0020) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_0020[ucs - 0x0020];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2195) {
      if (ucs >= 0x2192) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2192[ucs - 0x2192];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2469) {
      if (ucs >= 0x2460) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2460[ucs - 0x2460];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2666) {
      if (ucs >= 0x25A0) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_25A0[ucs - 0x25A0];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x27BE) {
      if (ucs >= 0x2701) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2701[ucs - 0x2701];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0xF8E4) {
      if (ucs >= 0xF8D7) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_F8D7[ucs - 0xF8D7];
        if (s[1]) return 22;
      }
    }
    break;
  case 23:	/* koi8-u */
    if (koi8_u_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 23;
    } 
    break;
  case 24:	/* microsoft-cp1251 */
    if (cp1251_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 24;
    } 
    break;
  case 26: /* gbk/cp936ext */
    if (cp936ext_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 26;
    }
    break;
  default:
    break;
  };
  return -1;
}